

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void reboot_now(CHAR_DATA *ch)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  CHAR_DATA *vch;
  DESCRIPTOR_DATA *d_next;
  DESCRIPTOR_DATA *d;
  DESCRIPTOR_DATA *in_stack_00001270;
  char *in_stack_000023e8;
  CHAR_DATA *in_stack_000023f0;
  char *in_stack_00003608;
  CHAR_DATA *in_stack_00003610;
  CHAR_DATA *in_stack_00004868;
  CHAR_DATA *local_28;
  DESCRIPTOR_DATA *local_10;
  
  do_force(in_stack_00003610,in_stack_00003608);
  do_echo(in_stack_000023f0,in_stack_000023e8);
  local_10 = descriptor_list;
  while (local_10 != (DESCRIPTOR_DATA *)0x0) {
    pDVar1 = local_10->next;
    if (local_10->original == (CHAR_DATA *)0x0) {
      local_28 = local_10->character;
    }
    else {
      local_28 = local_10->original;
    }
    if ((local_28 != (CHAR_DATA *)0x0) && (local_10->connected == 0)) {
      bVar2 = is_affected(local_28,(int)gsn_cloak_form);
      if (bVar2) {
        do_cloak(local_28,"auto");
      }
      save_char_obj(in_stack_00004868);
    }
    close_socket(in_stack_00001270);
    local_10 = pDVar1;
  }
  merc_down = true;
  return;
}

Assistant:

void reboot_now(CHAR_DATA *ch)
{
	DESCRIPTOR_DATA *d, *d_next;
	CHAR_DATA *vch;

	/*
	OBJ_DATA *t_obj, *obj;
	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if(obj->item_type != ITEM_CORPSE_PC || !obj->contains)
			continue;

		for(owner=char_list;owner!=nullptr;owner=owner->next)
		{
			if(!is_npc(owner) && !str_cmp(owner->true_name,obj->owner))
			{
				send_to_char("Your corpse decays.\n\r",owner);

				for (t_obj = obj->contains; t_obj != nullptr; t_obj = t_obj->next_content)
				{
					act_new("$p returns to you.",owner,t_obj,0,TO_CHAR,POS_DEAD);

					if(t_obj->item_type==ITEM_MONEY)
					{
						owner->gold += t_obj->value[1];
						extract_obj(t_obj);
						continue;
					}

					obj_from_obj(t_obj);
					obj_to_char(t_obj,owner);
				}

				extract_obj(obj);
				break;
			}
		}
	}
	*/

	do_force(ch, "all save");
	do_echo(ch, "*** REBOOTING NOW ***");

	for (d = descriptor_list; d != nullptr; d = d_next)
	{
		d_next = d->next;
		vch = d->original ? d->original : d->character;

		if (vch != nullptr && d->connected == 0)
		{
			if (is_affected(vch, gsn_cloak_form))
				do_cloak(vch, "auto");

			save_char_obj(vch);
		}

		close_socket(d);
	}

	merc_down = true;
}